

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTargetInternals::ComputeLinkImplementationLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,
          OptionalLinkImplementation *impl,cmTarget *head)

{
  size_type sVar1;
  bool bVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  size_type __n;
  int iVar4;
  int iVar5;
  PolicyStatus PVar6;
  LinkLibraryType LVar7;
  char *pcVar8;
  ostream *poVar9;
  cmake *this_00;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  ulong uVar11;
  cmTarget *pcVar12;
  pointer pcVar13;
  PolicyID id;
  MessageType t;
  string *item;
  pointer item_00;
  bool bVar14;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  auto_ptr<cmCompiledGeneratorExpression> local_348;
  OptionalLinkImplementation *local_340;
  pointer local_338;
  string *local_330;
  string local_328;
  string local_308;
  string *local_2e8;
  undefined1 local_2e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d0;
  string local_2b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_298;
  ulong local_290;
  pointer local_288;
  cmTarget *local_280;
  PolicyMap *local_278;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_270;
  cmListFileBacktrace *local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [360];
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_a0;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> local_68 [2];
  
  pcVar13 = (this->LinkImplementationPropertyEntries).
            super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_288 = (this->LinkImplementationPropertyEntries).
              super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_340 = impl;
  local_2e8 = config;
  local_280 = head;
  if (pcVar13 != local_288) {
    local_330 = &thisTarget->Name;
    local_278 = &thisTarget->PolicyMap;
    local_270 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&thisTarget->LinkImplicitNullProperties;
    local_298 = &thisTarget->MaxLanguageStandards;
    uVar11 = 0;
    do {
      local_2e0._8_8_ = (string *)0x0;
      aStack_2d0._M_allocated_capacity = 0;
      aStack_2d0._8_8_ = 0;
      local_250._8_6_ = 0x534549524152;
      local_250[0] = 'L';
      local_250._1_5_ = 0x4c5f4b4e49;
      local_250._6_2_ = 0x4249;
      local_260._8_8_ = 0xe;
      local_250[0xe] = '\0';
      local_338 = pcVar13;
      local_290 = uVar11;
      local_260._0_8_ = (cmCompiledGeneratorExpression *)local_250;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_e8,local_330,(string *)local_260,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_260._0_8_ !=
          (cmCompiledGeneratorExpression *)local_250) {
        operator_delete((void *)local_260._0_8_,
                        CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
      }
      local_268 = &local_338->Backtrace;
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_2e0,local_268);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_260,(string *)local_2e0);
      local_348.x_ = (cmCompiledGeneratorExpression *)local_260._0_8_;
      local_260._0_8_ = (pointer)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_260);
      local_260._8_8_ = 0;
      local_250[0] = '\0';
      local_260._0_8_ = (cmCompiledGeneratorExpression *)local_250;
      pcVar8 = cmCompiledGeneratorExpression::Evaluate
                         (local_348.x_,thisTarget->Makefile,local_2e8,false,local_280,
                          (cmGeneratorExpressionDAGChecker *)local_e8,(string *)local_260);
      std::__cxx11::string::string((string *)&local_2b8,pcVar8,(allocator *)&local_308);
      if ((cmCompiledGeneratorExpression *)local_260._0_8_ !=
          (cmCompiledGeneratorExpression *)local_250) {
        operator_delete((void *)local_260._0_8_,
                        CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
      }
      cmSystemTools::ExpandListArgument
                (&local_2b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_2e0 + 8),false);
      if ((local_348.x_)->HadHeadSensitiveCondition == true) {
        local_340->HadHeadSensitiveCondition = true;
      }
      item = (string *)local_2e0._8_8_;
      if (local_2e0._8_8_ != aStack_2d0._M_allocated_capacity) {
        do {
          cmTarget::CheckCMP0004(&local_308,thisTarget,item);
          __n = local_308._M_string_length;
          sVar1 = (thisTarget->Name)._M_string_length;
          if (local_308._M_string_length == sVar1) {
            if ((local_308._M_string_length == 0) ||
               (iVar4 = bcmp(local_308._M_dataplus._M_p,(local_330->_M_dataplus)._M_p,
                             local_308._M_string_length), iVar4 == 0)) goto LAB_002aea7c;
LAB_002aeb51:
            pcVar12 = cmTarget::FindTargetToLink(thisTarget,&local_308);
            bVar14 = true;
            if (local_2b8._M_string_length == (local_338->Value)._M_string_length) {
              if (local_2b8._M_string_length == 0) {
                bVar14 = false;
              }
              else {
                iVar4 = bcmp(local_2b8._M_dataplus._M_p,(local_338->Value)._M_dataplus._M_p,
                             local_2b8._M_string_length);
                bVar14 = iVar4 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_260,&local_308,pcVar12,local_268,bVar14);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_340,
                       (cmLinkImplItem *)local_260);
            std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                      ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                       (local_250 + 0x18));
            if ((cmCompiledGeneratorExpression *)local_260._0_8_ !=
                (cmCompiledGeneratorExpression *)local_250) {
              operator_delete((void *)local_260._0_8_,
                              CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
            }
            iVar4 = 0;
          }
          else {
            if (local_308._M_string_length != 0) goto LAB_002aeb51;
LAB_002aea7c:
            iVar4 = 7;
            if ((__n == sVar1) &&
               ((__n == 0 ||
                (iVar5 = bcmp(local_308._M_dataplus._M_p,(local_330->_M_dataplus)._M_p,__n),
                iVar5 == 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
              PVar6 = cmPolicies::PolicyMap::Get(local_278,CMP0038);
              t = FATAL_ERROR;
              if (PVar6 == OLD) {
                bVar2 = true;
                bVar14 = true;
              }
              else {
                if (PVar6 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_328,(cmPolicies *)0x26,id);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_260,local_328._M_dataplus._M_p,
                                      local_328._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._M_dataplus._M_p != &local_328.field_2) {
                    operator_delete(local_328._M_dataplus._M_p,
                                    local_328.field_2._M_allocated_capacity + 1);
                  }
                  bVar2 = false;
                  t = AUTHOR_WARNING;
                }
                else {
                  bVar2 = true;
                }
                bVar14 = false;
              }
              if (!bVar14) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_260,"Target \"",8);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_260,(thisTarget->Name)._M_dataplus._M_p,
                                    (thisTarget->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\" links to itself.",0x12);
                this_00 = cmMakefile::GetCMakeInstance(thisTarget->Makefile);
                std::__cxx11::stringbuf::str();
                cmake::IssueMessage(this_00,t,&local_328,
                                    &((thisTarget->Internal).Pointer)->Backtrace);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._M_allocated_capacity + 1);
                }
                if (bVar2) {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
                  std::ios_base::~ios_base((ios_base *)(local_250 + 0x60));
                  iVar4 = 1;
                  goto LAB_002aebf6;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
              std::ios_base::~ios_base((ios_base *)(local_250 + 0x60));
            }
          }
LAB_002aebf6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
          }
          if ((iVar4 != 7) && (iVar4 != 0)) goto LAB_002aed52;
          item = item + 1;
        } while (item != (string *)aStack_2d0._M_allocated_capacity);
      }
      iVar4 = 5;
LAB_002aed52:
      if (iVar4 == 5) {
        psVar3 = &(local_348.x_)->SeenTargetProperties;
        for (p_Var10 = ((local_348.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          pcVar8 = cmTarget::GetProperty(thisTarget,(string *)(p_Var10 + 1),thisTarget->Makefile);
          if (pcVar8 == (char *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1));
          }
        }
        iVar4 = 0;
        cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_348.x_,thisTarget,local_298);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_348);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_2e0);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector(local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._8_8_ != &local_d0) {
        operator_delete((void *)local_e8._8_8_,local_d0._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 8));
      if (iVar4 != 0) {
        if ((local_290 & 1) == 0) {
          return;
        }
        break;
      }
      pcVar13 = local_338 + 1;
      uVar11 = CONCAT71((int7)((ulong)extraout_RAX >> 8),pcVar13 == local_288);
    } while (pcVar13 != local_288);
  }
  LVar7 = cmTarget::ComputeLinkType(thisTarget,local_2e8);
  item_00 = (thisTarget->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (item_00 !=
      (thisTarget->OriginalLinkLibraries).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_340 = (OptionalLinkImplementation *)
                &(local_340->super_LinkImplementation).super_LinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item_00->second != GENERAL) && (item_00->second != LVar7)) {
        cmTarget::CheckCMP0004((string *)local_e8,thisTarget,&item_00->first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(thisTarget->Name)._M_string_length) {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             (iVar4 = bcmp((void *)local_e8._0_8_,(thisTarget->Name)._M_dataplus._M_p,local_e8._8_8_
                          ), iVar4 != 0)) {
LAB_002aef3e:
            pcVar12 = cmTarget::FindTargetToLink(thisTarget,(string *)local_e8);
            local_260._0_8_ = local_250;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_260,local_e8._0_8_,(char *)(local_e8._8_8_ + local_e8._0_8_))
            ;
            local_250._16_8_ = pcVar12;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_340,
                       (cmLinkItem *)local_260);
            if ((cmCompiledGeneratorExpression *)local_260._0_8_ !=
                (cmCompiledGeneratorExpression *)local_250) {
              operator_delete((void *)local_260._0_8_,
                              CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
            }
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e8._8_8_ !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) goto LAB_002aef3e;
        if ((cmGeneratorExpressionDAGChecker *)local_e8._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
      }
      item_00 = item_00 + 1;
    } while (item_00 !=
             (thisTarget->OriginalLinkLibraries).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void
cmTargetInternals::ComputeLinkImplementationLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkImplementation& impl,
  cmTarget const* head) const
{
  // Collect libraries directly linked in this configuration.
  for (std::vector<cmValueWithOrigin>::const_iterator
      le = this->LinkImplementationPropertyEntries.begin(),
      end = this->LinkImplementationPropertyEntries.end();
      le != end; ++le)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        thisTarget->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(&le->Backtrace);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(le->Value);
    std::string const evaluated =
      cge->Evaluate(thisTarget->Makefile, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = thisTarget->CheckCMP0004(*li);
      if(name == thisTarget->GetName() || name.empty())
        {
        if(name == thisTarget->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(thisTarget->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << thisTarget->GetName() << "\" links to itself.";
            thisTarget->Makefile->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), thisTarget->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, thisTarget->FindTargetToLink(name),
                       le->Backtrace, evaluated != le->Value));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!thisTarget->GetProperty(*it))
        {
        thisTarget->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(thisTarget, thisTarget->MaxLanguageStandards);
    }

  cmTarget::LinkLibraryType linkType = thisTarget->ComputeLinkType(config);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    thisTarget->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != cmTarget::GENERAL && li->second != linkType)
      {
      std::string name = thisTarget->CheckCMP0004(li->first);
      if(name == thisTarget->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, thisTarget->FindTargetToLink(name)));
      }
    }
}